

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O2

BeagleBenchmarkedResourceList *
beagleGetBenchmarkedResourceList
          (int tipCount,int compactBufferCount,int stateCount,int patternCount,int categoryCount,
          int *resourceList,int resourceCount,long preferenceFlags,long requirementFlags,
          int eigenModelCount,int partitionCount,int calculateDerivatives,long benchmarkFlags)

{
  BeagleResource *pBVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  int rateCategoryCount;
  int iVar5;
  int iVar6;
  _List_node_base *this;
  list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> *this_00;
  BeagleBenchmarkedResourceList *pBVar7;
  BeagleBenchmarkedResource *pBVar8;
  long lVar9;
  list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> *plVar10;
  _List_node_base *p_Var11;
  undefined4 in_register_00000034;
  bool bVar12;
  int resourceNumber;
  int local_a4;
  undefined8 local_a0;
  long benchedFlags;
  double itBenchmarkResult;
  double benchmarkResultCPU;
  char *implName;
  char *local_78;
  char *pcStack_70;
  long local_68;
  long lStack_60;
  
  local_a0 = CONCAT44(in_register_00000034,compactBufferCount);
  local_a4 = categoryCount;
  if (rsrcList == (BeagleResourceList *)0x0) {
    beagleGetResourceList();
  }
  if (implFactory_abi_cxx11_ ==
      (list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)0x0) {
    beagleGetFactoryList_abi_cxx11_();
  }
  this = (_List_node_base *)operator_new(0x18);
  this->_M_prev = this;
  this->_M_next = this;
  this[1]._M_next = (_List_node_base *)0x0;
  iVar5 = filterResources(resourceList,resourceCount,preferenceFlags,requirementFlags,
                          (PairedList *)this);
  rateCategoryCount = local_a4;
  if (iVar5 == 0) {
    this_00 = (list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> *)
              operator_new(0x18);
    *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> **)(this_00 + 8) =
         this_00;
    *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> **)this_00 = this_00
    ;
    *(undefined8 *)(this_00 + 0x10) = 0;
    p_Var11 = this;
    while (p_Var11 = (((_List_impl *)&p_Var11->_M_next)->_M_node).super__List_node_base._M_next,
          p_Var11 != this) {
      implName._0_4_ = *(int *)((long)&p_Var11[1]._M_next + 4);
      pBVar1 = rsrcList->list + (int)implName;
      local_78 = pBVar1->name;
      pcStack_70 = pBVar1->description;
      plVar2 = &rsrcList->list[(int)implName].supportFlags;
      local_68 = *plVar2;
      lStack_60 = plVar2[1];
      std::__cxx11::list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_>::
      push_back((list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_> *)
                this_00,(value_type *)&implName);
    }
    std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
              ((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this);
    operator_delete(this);
    iVar5 = 1;
    if ((benchmarkFlags & 2U) == 0) {
      iVar5 = 0x1e;
    }
    iVar6 = beagle::benchmark::benchmarkResource
                      (0,stateCount,tipCount,patternCount,(benchmarkFlags & 1U) == 0,
                       rateCategoryCount,0xf,(int)local_a0,iVar5,calculateDerivatives != 0,
                       calculateDerivatives != 0,eigenModelCount,partitionCount,
                       requirementFlags | preferenceFlags,0,&resourceNumber,&implName,&benchedFlags,
                       &benchmarkResultCPU,false);
    pBVar7 = (BeagleBenchmarkedResourceList *)0x0;
    if (iVar6 == 0) {
      plVar10 = this_00;
      while (plVar10 = *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>>
                         **)plVar10, plVar10 != this_00) {
        iVar6 = beagle::benchmark::benchmarkResource
                          (*(int *)(plVar10 + 0x10),stateCount,tipCount,patternCount,
                           (benchmarkFlags & 1U) == 0,rateCategoryCount,0xf,(int)local_a0,iVar5,
                           calculateDerivatives != 0,calculateDerivatives != 0,eigenModelCount,
                           partitionCount,preferenceFlags,requirementFlags,&resourceNumber,&implName
                           ,&benchedFlags,&itBenchmarkResult,*(int *)(plVar10 + 0x10) == 0);
        *(int *)(plVar10 + 0x38) = iVar6;
        *(int *)(plVar10 + 0x10) = resourceNumber;
        bVar12 = resourceNumber == 0;
        *(long *)(plVar10 + 0x48) = benchedFlags;
        *(ulong *)(plVar10 + 0x40) = CONCAT44(implName._4_4_,(int)implName);
        *(ulong *)(plVar10 + 0x50) =
             (ulong)bVar12 * (long)benchmarkResultCPU + (ulong)!bVar12 * (long)itBenchmarkResult;
        *(ulong *)(plVar10 + 0x58) =
             (ulong)bVar12 * 0x3ff0000000000000 +
             (ulong)!bVar12 * (long)(benchmarkResultCPU / itBenchmarkResult);
      }
      std::__cxx11::list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>>::
      sort<bool(*)(BeagleBenchmarkedResource_const&,BeagleBenchmarkedResource_const&)>
                (this_00,compareBenchmarkResult);
      if (rsrcBenchList != (BeagleBenchmarkedResourceList *)0x0) {
        free(rsrcBenchList->list);
        free(rsrcBenchList);
      }
      pBVar7 = (BeagleBenchmarkedResourceList *)malloc(0x10);
      uVar4 = *(undefined8 *)(this_00 + 0x10);
      rsrcBenchList = pBVar7;
      pBVar7->length = (int)uVar4;
      pBVar8 = (BeagleBenchmarkedResource *)malloc((long)(int)uVar4 * 0x50);
      pBVar7->list = pBVar8;
      lVar9 = 0;
      plVar10 = this_00;
      while (plVar10 = *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>>
                         **)plVar10, plVar10 != this_00) {
        *(undefined4 *)((long)&pBVar8->number + lVar9) = *(undefined4 *)(plVar10 + 0x10);
        *(undefined8 *)((long)&pBVar8->name + lVar9) = *(undefined8 *)(plVar10 + 0x18);
        *(undefined8 *)((long)&rsrcBenchList->list->description + lVar9) =
             *(undefined8 *)(plVar10 + 0x20);
        uVar4 = *(undefined8 *)(plVar10 + 0x30);
        pBVar8 = rsrcBenchList->list;
        puVar3 = (undefined8 *)((long)&pBVar8->supportFlags + lVar9);
        *puVar3 = *(undefined8 *)(plVar10 + 0x28);
        puVar3[1] = uVar4;
        *(undefined4 *)((long)&pBVar8->returnCode + lVar9) = *(undefined4 *)(plVar10 + 0x38);
        *(undefined8 *)((long)&pBVar8->implName + lVar9) = *(undefined8 *)(plVar10 + 0x40);
        pBVar8 = rsrcBenchList->list;
        *(undefined8 *)((long)&pBVar8->benchedFlags + lVar9) = *(undefined8 *)(plVar10 + 0x48);
        uVar4 = *(undefined8 *)(plVar10 + 0x58);
        puVar3 = (undefined8 *)((long)&pBVar8->benchmarkResult + lVar9);
        *puVar3 = *(undefined8 *)(plVar10 + 0x50);
        puVar3[1] = uVar4;
        lVar9 = lVar9 + 0x50;
      }
      std::__cxx11::
      _List_base<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_>::_M_clear
                ((_List_base<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_>
                  *)this_00);
      operator_delete(this_00);
      pBVar7 = rsrcBenchList;
    }
  }
  else {
    std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
              ((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this);
    operator_delete(this);
    pBVar7 = (BeagleBenchmarkedResourceList *)0x0;
  }
  return pBVar7;
}

Assistant:

BeagleBenchmarkedResourceList* beagleGetBenchmarkedResourceList(int tipCount,
                                                                int compactBufferCount,
                                                                int stateCount,
                                                                int patternCount,
                                                                int categoryCount,
                                                                int* resourceList,
                                                                int resourceCount,
                                                                long preferenceFlags,
                                                                long requirementFlags,
                                                                int eigenModelCount,
                                                                int partitionCount,
                                                                int calculateDerivatives,
                                                                long benchmarkFlags) {

#ifdef BEAGLE_DEBUG_FP_REDUCED_PRECISION
    debugPatternCount = patternCount;
#endif

    if (rsrcList == NULL)
        beagleGetResourceList();

    if (implFactory == NULL)
        beagleGetFactoryList();

    int errorCode = BEAGLE_SUCCESS;

    PairedList* possibleResources = new PairedList;

    errorCode = filterResources(resourceList,
                                resourceCount,
                                preferenceFlags,
                                requirementFlags,
                                possibleResources);

    if (errorCode != BEAGLE_SUCCESS) {
        delete possibleResources;
        return NULL;
    }

    RsrcBenchPairList *filteredRsrcBenchList = new RsrcBenchPairList;

    for(PairedList::iterator it = possibleResources->begin(); it != possibleResources->end(); ++it) {
        int resource = (*it).second;

        BeagleBenchmarkedResource itResource;
        itResource.number        = resource;
        itResource.name          = rsrcList->list[resource].name;
        itResource.description   = rsrcList->list[resource].description;
        itResource.supportFlags  = rsrcList->list[resource].supportFlags;
        itResource.requiredFlags = rsrcList->list[resource].requiredFlags;

        filteredRsrcBenchList->push_back(itResource);
    }

    delete possibleResources;

    bool manualScaling = (benchmarkFlags & BEAGLE_BENCHFLAG_SCALING_NONE ? false : true);
    int benchmarkReplicates = BENCHMARK_REPLICATES;
    int rescaleFrequency =
        (benchmarkFlags & BEAGLE_BENCHFLAG_SCALING_ALWAYS ? 1 : BENCHMARK_REPLICATES*2);

    int resourceNumber;
    char* implName;
    long benchedFlags;
    double benchmarkResultCPU;

    bool instOnly = false;

    errorCode = beagle::benchmark::benchmarkResource(0,
                                  stateCount,
                                  tipCount,
                                  patternCount,
                                  manualScaling,
                                  categoryCount,
                                  benchmarkReplicates,
                                  compactBufferCount,
                                  rescaleFrequency,
                                  (calculateDerivatives ? true : false),
                                  calculateDerivatives,
                                  eigenModelCount,
                                  partitionCount,
                                  preferenceFlags | requirementFlags,
                                  0,
                                  &resourceNumber,
                                  &implName,
                                  &benchedFlags,
                                  &benchmarkResultCPU,
                                  instOnly);

    if (errorCode != BEAGLE_SUCCESS) {
        return NULL;
    }

    for(RsrcBenchPairList::iterator it = filteredRsrcBenchList->begin();
        it != filteredRsrcBenchList->end(); ++it) {

        if ((*it).number == 0) {
            instOnly = true;
        } else {
            instOnly = false;
        }

        double itBenchmarkResult;

        (*it).returnCode = beagle::benchmark::benchmarkResource((*it).number,
                                                     stateCount,
                                                     tipCount,
                                                     patternCount,
                                                     manualScaling,
                                                     categoryCount,
                                                     benchmarkReplicates,
                                                     compactBufferCount,
                                                     rescaleFrequency,
                                                     (calculateDerivatives ? true : false),
                                                     calculateDerivatives,
                                                     eigenModelCount,
                                                     partitionCount,
                                                     preferenceFlags,
                                                     requirementFlags,
                                                     &resourceNumber,
                                                     &implName,
                                                     &benchedFlags,
                                                     &itBenchmarkResult,
                                                     instOnly);

        (*it).number         = resourceNumber;
        (*it).benchedFlags   = benchedFlags;
        (*it).implName       = implName;

        if ((*it).number == 0) {
            (*it).benchmarkResult = benchmarkResultCPU;
            (*it).performanceRatio = 1.0;
        } else {
            (*it).benchmarkResult = itBenchmarkResult;
            (*it).performanceRatio = benchmarkResultCPU / (*it).benchmarkResult;
        }
    }

    filteredRsrcBenchList->sort(compareBenchmarkResult); // order from fastest to slowest

   if (rsrcBenchList != NULL) {
        free(rsrcBenchList->list);
        free(rsrcBenchList);
    }

    rsrcBenchList = (BeagleBenchmarkedResourceList*) malloc(sizeof(BeagleBenchmarkedResourceList));
    rsrcBenchList->length = filteredRsrcBenchList->size();
    rsrcBenchList->list = (BeagleBenchmarkedResource*) malloc(sizeof(BeagleBenchmarkedResource) * rsrcBenchList->length);

    int i = 0;
    for(RsrcBenchPairList::iterator it = filteredRsrcBenchList->begin();
        it != filteredRsrcBenchList->end(); ++it) {
        rsrcBenchList->list[i].number           = (*it).number;
        rsrcBenchList->list[i].name             = (*it).name;
        rsrcBenchList->list[i].description      = (*it).description;
        rsrcBenchList->list[i].supportFlags     = (*it).supportFlags;
        rsrcBenchList->list[i].requiredFlags    = (*it).requiredFlags;
        rsrcBenchList->list[i].returnCode       = (*it).returnCode;
        rsrcBenchList->list[i].implName         = (*it).implName;
        rsrcBenchList->list[i].benchedFlags     = (*it).benchedFlags;
        rsrcBenchList->list[i].benchmarkResult  = (*it).benchmarkResult;
        rsrcBenchList->list[i].performanceRatio = (*it).performanceRatio;
        i++;
    }

    delete filteredRsrcBenchList;

    return rsrcBenchList;
}